

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

Node * __thiscall
icu_63::UCharsTrieBuilder::createLinearMatchNode
          (UCharsTrieBuilder *this,int32_t i,int32_t unitIndex,int32_t length,Node *nextNode)

{
  UCharsTrieBuilder *this_00;
  char16_t *pcVar1;
  undefined4 in_register_00000034;
  UCharsTrieBuilder *local_90;
  UnicodeString local_78;
  undefined1 local_31;
  Node *local_30;
  Node *nextNode_local;
  int32_t local_20;
  int32_t length_local;
  int32_t unitIndex_local;
  int32_t i_local;
  UCharsTrieBuilder *this_local;
  
  local_30 = nextNode;
  nextNode_local._4_4_ = length;
  local_20 = unitIndex;
  length_local = i;
  _unitIndex_local = this;
  this_00 = (UCharsTrieBuilder *)
            UMemory::operator_new((UMemory *)0x30,CONCAT44(in_register_00000034,i));
  local_90 = (UCharsTrieBuilder *)0x0;
  if (this_00 != (UCharsTrieBuilder *)0x0) {
    local_31 = 1;
    UCharsTrieElement::getString(&local_78,this->elements + length_local,&this->strings);
    pcVar1 = UnicodeString::getBuffer(&local_78);
    UCTLinearMatchNode::UCTLinearMatchNode
              ((UCTLinearMatchNode *)this_00,pcVar1 + local_20,nextNode_local._4_4_,local_30);
    local_90 = this_00;
  }
  local_31 = 0;
  this_local = local_90;
  if (this_00 != (UCharsTrieBuilder *)0x0) {
    UnicodeString::~UnicodeString(&local_78);
  }
  return (Node *)this_local;
}

Assistant:

StringTrieBuilder::Node *
UCharsTrieBuilder::createLinearMatchNode(int32_t i, int32_t unitIndex, int32_t length,
                                         Node *nextNode) const {
    return new UCTLinearMatchNode(
            elements[i].getString(strings).getBuffer()+unitIndex,
            length,
            nextNode);
}